

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# az.hpp
# Opt level: O1

AuthFields * __thiscall
arbiter::drivers::AZ::Config::authFields(AuthFields *__return_storage_ptr__,Config *this)

{
  pointer pcVar1;
  string local_60;
  string local_40;
  
  pcVar1 = (this->m_storageAccount)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->m_storageAccount)._M_string_length);
  pcVar1 = (this->m_storageAccessKey)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->m_storageAccessKey)._M_string_length);
  AuthFields::AuthFields(__return_storage_ptr__,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

AuthFields authFields() const { return AuthFields(m_storageAccount, m_storageAccessKey); }